

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

String * __thiscall
cm::String::replace(String *this,const_iterator first,const_iterator last,size_type count2,char ch)

{
  type pSVar1;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::__cxx11::string::replace
            ((ulong)&local_50,local_50._M_string_length,(char *)0x0,(ulong)(this->view_)._M_str);
  std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,(char)count2);
  std::__cxx11::string::replace((ulong)&local_50,local_50._M_string_length,(char *)0x0,(ulong)last);
  pSVar1 = operator=(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return pSVar1;
}

Assistant:

String& replace(const_iterator first, const_iterator last, size_type count2,
                  char ch)
  {
    std::string out;
    out.reserve((first - view_.begin()) + count2 + (view_.end() - last));
    out.append(view_.begin(), first);
    out.append(count2, ch);
    out.append(last, view_.end());
    return *this = std::move(out);
  }